

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int lyp_data_check_options(ly_ctx *ctx,int options,char *func)

{
  uint uVar1;
  int x;
  char *func_local;
  int options_local;
  ly_ctx *ctx_local;
  
  uVar1 = options & 0x10000ff;
  if (((options & 0x4000U) == 0) || ((uVar1 != 8 && (uVar1 != 0x80)))) {
    if (((options & 0x30000U) == 0) || (uVar1 == 0)) {
      if ((uVar1 == 0) || ((uVar1 != 0 && ((uVar1 & uVar1 - 1) == 0)))) {
        ctx_local._4_4_ = 0;
      }
      else {
        ly_log(ctx,LY_LLERR,LY_EINVAL,"%s: Invalid options 0x%x (multiple data type flags set).",
               func,(ulong)(uint)options);
        ctx_local._4_4_ = 1;
      }
    }
    else {
      ly_log(ctx,LY_LLERR,LY_EINVAL,
             "%s: Invalid options 0x%x (LYD_OPT_DATA_*_YANGLIB can be used only with LYD_OPT_DATA)",
             func,(ulong)(uint)options);
      ctx_local._4_4_ = 1;
    }
  }
  else {
    ly_log(ctx,LY_LLERR,LY_EINVAL,
           "%s: Invalid options 0x%x (LYD_OPT_DATA_WHENAUTODEL can be used only with LYD_OPT_DATA or LYD_OPT_CONFIG)"
           ,func,(ulong)(uint)options);
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

int
lyp_data_check_options(struct ly_ctx *ctx, int options, const char *func)
{
    int x = options & LYD_OPT_TYPEMASK;

    /* LYD_OPT_WHENAUTODEL can be used only with LYD_OPT_DATA or LYD_OPT_CONFIG */
    if (options & LYD_OPT_WHENAUTODEL) {
        if ((x == LYD_OPT_EDIT) || (x == LYD_OPT_NOTIF_FILTER)) {
            LOGERR(ctx, LY_EINVAL, "%s: Invalid options 0x%x (LYD_OPT_DATA_WHENAUTODEL can be used only with LYD_OPT_DATA or LYD_OPT_CONFIG)",
                   func, options);
            return 1;
        }
    }

    if (options & (LYD_OPT_DATA_ADD_YANGLIB | LYD_OPT_DATA_NO_YANGLIB)) {
        if (x != LYD_OPT_DATA) {
            LOGERR(ctx, LY_EINVAL, "%s: Invalid options 0x%x (LYD_OPT_DATA_*_YANGLIB can be used only with LYD_OPT_DATA)",
                   func, options);
            return 1;
        }
    }

    /* "is power of 2" algorithm, with 0 exception */
    if (x && !(x && !(x & (x - 1)))) {
        LOGERR(ctx, LY_EINVAL, "%s: Invalid options 0x%x (multiple data type flags set).", func, options);
        return 1;
    }

    return 0;
}